

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

char * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getStringUnchecked(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,
                  ValueLength *length)

{
  byte bVar1;
  uint8_t *puVar2;
  unsigned_long uVar3;
  unsigned_long *in_RSI;
  uint8_t h;
  uint8_t *local_8;
  
  bVar1 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12028c);
  if ((bVar1 < 0x40) || (0xbe < bVar1)) {
    puVar2 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1202d6);
    uVar3 = readIntegerFixed<unsigned_long,8ul>(puVar2 + 1);
    *in_RSI = uVar3;
    local_8 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1202f6)
    ;
    local_8 = local_8 + 9;
  }
  else {
    *in_RSI = (long)(int)(bVar1 - 0x40);
    local_8 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1202c2)
    ;
    local_8 = local_8 + 1;
  }
  return (char *)local_8;
}

Assistant:

char const* getStringUnchecked(ValueLength& length) const noexcept {
    uint8_t const h = head();
    if (h >= 0x40 && h <= 0xbe) {
      // short UTF-8 String
      length = h - 0x40;
      return reinterpret_cast<char const*>(start() + 1);
    }

    // long UTF-8 String
    length = readIntegerFixed<ValueLength, 8>(start() + 1);
    return reinterpret_cast<char const*>(start() + 1 + 8);
  }